

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Ed25519.c
# Opt level: O0

_Bool Hacl_Ed25519_verify(uint8_t *public,uint8_t *msg,uint32_t len1,uint8_t *signature)

{
  _Bool _Var1;
  undefined8 in_RCX;
  undefined4 in_EDX;
  uint8_t *in_RSI;
  uint8_t *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  
  _Var1 = Hacl_Impl_Ed25519_Verify_verify
                    (in_RSI,(uint8_t *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                     (uint32_t)((ulong)in_RCX >> 0x20),in_stack_ffffffffffffffd8);
  return _Var1;
}

Assistant:

bool Hacl_Ed25519_verify(uint8_t *public, uint8_t *msg, uint32_t len1, uint8_t *signature)
{
  return Hacl_Impl_Ed25519_Verify_verify(public, msg, len1, signature);
}